

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img.hpp
# Opt level: O0

Img<glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
tg::Img<glm::vec<3,_float,_(glm::qualifier)0>_>::operator=
          (Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this,
          Img<glm::vec<3,_float,_(glm::qualifier)0>_> *o)

{
  Img<glm::vec<3,_float,_(glm::qualifier)0>_> *o_local;
  Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this_local;
  
  free((this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data);
  (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._w =
       (o->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._w;
  (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._h =
       (o->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._h;
  (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._stride =
       (o->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._stride;
  (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data =
       (o->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data;
  (o->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data =
       (vec<3,_float,_(glm::qualifier)0> *)0x0;
  return this;
}

Assistant:

Img<T>& Img<T>::operator=(Img&& o)
{
    free(Img<T>::_data);
    Img<T>::_w = o._w;
    Img<T>::_h = o._h;
    Img<T>::_stride = o._stride;
    Img<T>::_data = o._data;
    o._data = nullptr;
    return *this;
}